

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  string *classname;
  bool bVar1;
  bool bVar2;
  LogMessage *pLVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  classname = &this->classname_;
  bVar1 = ClassNameResolver::HasConflictingClassName
                    (this->name_resolver_,this->file_,classname,EXACT_EQUAL);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)error);
    std::__cxx11::string::append((char *)error);
    std::__cxx11::string::append((string *)error);
    std::__cxx11::string::append((char *)error);
  }
  else {
    bVar2 = ClassNameResolver::HasConflictingClassName
                      (this->name_resolver_,this->file_,classname,EQUAL_IGNORE_CASE);
    if (bVar2) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0xe6);
      pLVar3 = internal::LogMessage::operator<<(&local_58,*(string **)this->file_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3,": The file\'s outer class name, \"");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,classname);
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"\", matches the name of one of the types declared inside it when "
                         );
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"case is ignored. This can cause compilation issues on Windows / ")
      ;
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"MacOS. Please either rename the type or use the ");
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"java_outer_classname option to specify a different outer class ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,"name for the .proto file to be safe.");
      internal::LogFinisher::operator=(&local_59,pLVar3);
      internal::LogMessage::~LogMessage(&local_58);
    }
    if ((*(int *)(*(long *)(this->file_ + 0x88) + 0xa4) == 3) &&
       ((this->options_).enforce_lite == false)) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0xf2);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_58,
                          "The optimize_for = LITE_RUNTIME option is no longer supported by ");
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"protobuf Java code generator and is ignored--protoc will always ")
      ;
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"generate full runtime code for Java. To use Java Lite runtime, ");
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,"users should use the Java Lite plugin instead. See:\n");
      pLVar3 = internal::LogMessage::operator<<
                         (pLVar3,
                          "  https://github.com/protocolbuffers/protobuf/blob/master/java/lite.md");
      internal::LogFinisher::operator=(&local_59,pLVar3);
      internal::LogMessage::~LogMessage(&local_58);
    }
  }
  return !bVar1;
}

Assistant:

bool FileGenerator::Validate(std::string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  if (name_resolver_->HasConflictingClassName(file_, classname_,
                                              NameEquality::EXACT_EQUAL)) {
    error->assign(file_->name());
    error->append(
        ": Cannot generate Java output because the file's outer class name, "
        "\"");
    error->append(classname_);
    error->append(
        "\", matches the name of one of the types declared inside it.  "
        "Please either rename the type or use the java_outer_classname "
        "option to specify a different outer class name for the .proto file.");
    return false;
  }
  // Similar to the check above, but ignore the case this time. This is not a
  // problem on Linux, but will lead to Java compile errors on Windows / Mac
  // because filenames are case-insensitive on those platforms.
  if (name_resolver_->HasConflictingClassName(
          file_, classname_, NameEquality::EQUAL_IGNORE_CASE)) {
    GOOGLE_LOG(WARNING)
        << file_->name() << ": The file's outer class name, \"" << classname_
        << "\", matches the name of one of the types declared inside it when "
        << "case is ignored. This can cause compilation issues on Windows / "
        << "MacOS. Please either rename the type or use the "
        << "java_outer_classname option to specify a different outer class "
        << "name for the .proto file to be safe.";
  }

  // Print a warning if optimize_for = LITE_RUNTIME is used.
  if (file_->options().optimize_for() == FileOptions::LITE_RUNTIME &&
      !options_.enforce_lite) {
    GOOGLE_LOG(WARNING)
        << "The optimize_for = LITE_RUNTIME option is no longer supported by "
        << "protobuf Java code generator and is ignored--protoc will always "
        << "generate full runtime code for Java. To use Java Lite runtime, "
        << "users should use the Java Lite plugin instead. See:\n"
        << "  "
           "https://github.com/protocolbuffers/protobuf/blob/master/java/"
           "lite.md";
  }
  return true;
}